

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIteratorImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMNodeIteratorImpl::DOMNodeIteratorImpl
          (DOMNodeIteratorImpl *this,DOMNodeIteratorImpl *toCopy)

{
  DOMNodeIteratorImpl *toCopy_local;
  DOMNodeIteratorImpl *this_local;
  
  DOMNodeIterator::DOMNodeIterator(&this->super_DOMNodeIterator,&toCopy->super_DOMNodeIterator);
  (this->super_DOMNodeIterator)._vptr_DOMNodeIterator =
       (_func_int **)&PTR__DOMNodeIteratorImpl_0052b638;
  this->fRoot = toCopy->fRoot;
  this->fDocument = toCopy->fDocument;
  this->fWhatToShow = toCopy->fWhatToShow;
  this->fNodeFilter = toCopy->fNodeFilter;
  this->fExpandEntityReferences = (bool)(toCopy->fExpandEntityReferences & 1);
  this->fDetached = (bool)(toCopy->fDetached & 1);
  this->fCurrentNode = toCopy->fCurrentNode;
  this->fForward = (bool)(toCopy->fForward & 1);
  return;
}

Assistant:

DOMNodeIteratorImpl::DOMNodeIteratorImpl ( const DOMNodeIteratorImpl& toCopy)
    : DOMNodeIterator(toCopy),
    fRoot(toCopy.fRoot),
    fDocument(toCopy.fDocument),
    fWhatToShow(toCopy.fWhatToShow),
    fNodeFilter(toCopy.fNodeFilter),
    fExpandEntityReferences(toCopy.fExpandEntityReferences),
    fDetached(toCopy.fDetached),
    fCurrentNode(toCopy.fCurrentNode),
    fForward(toCopy.fForward)
{
}